

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O0

pair<unsigned_long,_unsigned_long>
mxx::allreduce<std::pair<unsigned_long,unsigned_long>,pair_sum<unsigned_long,unsigned_long>>
          (undefined8 x,MPI_Op param_2)

{
  MPI_Datatype poVar1;
  MPI_Op poVar2;
  MPI_Comm poVar3;
  undefined1 local_70 [8];
  custom_op<std::pair<unsigned_long,_unsigned_long>,_true> op;
  comm *comm_local;
  pair<unsigned_long,_unsigned_long> *x_local;
  undefined1 local_18 [8];
  pair<unsigned_long,_unsigned_long> result;
  
  op.m_op = param_2;
  custom_op<std::pair<unsigned_long,unsigned_long>,true>::
  custom_op<pair_sum<unsigned_long,unsigned_long>>
            ((custom_op<std::pair<unsigned_long,unsigned_long>,true> *)local_70);
  std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_unsigned_long,_true>
            ((pair<unsigned_long,_unsigned_long> *)local_18);
  poVar1 = custom_op<std::pair<unsigned_long,_unsigned_long>,_true>::get_type
                     ((custom_op<std::pair<unsigned_long,_unsigned_long>,_true> *)local_70);
  poVar2 = custom_op<std::pair<unsigned_long,_unsigned_long>,_true>::get_op
                     ((custom_op<std::pair<unsigned_long,_unsigned_long>,_true> *)local_70);
  poVar3 = comm::operator_cast_to_ompi_communicator_t_((comm *)op.m_op);
  MPI_Allreduce(x,local_18,1,poVar1,poVar2,poVar3);
  custom_op<std::pair<unsigned_long,_unsigned_long>,_true>::~custom_op
            ((custom_op<std::pair<unsigned_long,_unsigned_long>,_true> *)local_70);
  return _local_18;
}

Assistant:

inline T allreduce(const T& x, Func func, const mxx::comm& comm = mxx::comm()) {
    // get custom op (and type for custom op)
    mxx::custom_op<T> op(std::forward<Func>(func));
    // perform reduction
    T result;
    MPI_Allreduce(const_cast<T*>(&x), &result, 1, op.get_type(), op.get_op(), comm);
    return result;
}